

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

ctrl_t * phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                   (void)

{
  return EmptyGroup<std::is_same<std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         ::empty_group;
}

Assistant:

inline ctrl_t* EmptyGroup() {
  PHMAP_IF_CONSTEXPR (std_alloc_t::value) {
      alignas(16) static constexpr ctrl_t empty_group[] = {
          kSentinel, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty,
          kEmpty,    kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty};

      return const_cast<ctrl_t*>(empty_group);
  } else {
       return nullptr;
  }
}